

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

hwaddr do_translate_address
                 (CPUMIPSState_conflict5 *env,target_ulong address,int rw,uintptr_t retaddr)

{
  hwaddr hVar1;
  undefined4 in_register_00000014;
  CPUMIPSState_conflict5 *__mptr;
  
  hVar1 = cpu_mips_translate_address_mips64el(env,address,0);
  if (hVar1 != 0xffffffffffffffff) {
    return hVar1;
  }
  cpu_loop_exit_restore_mips64el
            ((CPUState *)(env[-3].tcs[0xc].gpr + 0x12),CONCAT44(in_register_00000014,rw));
}

Assistant:

static inline hwaddr do_translate_address(CPUMIPSState *env,
                                                      target_ulong address,
                                                      int rw, uintptr_t retaddr)
{
    hwaddr paddr;
    CPUState *cs = env_cpu(env);

    paddr = cpu_mips_translate_address(env, address, rw);

    if (paddr == -1LL) {
        cpu_loop_exit_restore(cs, retaddr);
    } else {
        return paddr;
    }
}